

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void ecs_dump_world_stats(ecs_world_t *world,ecs_world_stats_t *s)

{
  int32_t t_00;
  int32_t t;
  ecs_world_stats_t *s_local;
  ecs_world_t *world_local;
  
  t_00 = s->t;
  print_counter("Frame",t_00,&s->frame_count_total);
  printf("-------------------------------------\n");
  print_counter("pipeline rebuilds",t_00,&s->pipeline_build_count_total);
  print_counter("systems ran last frame",t_00,&s->systems_ran_frame);
  printf("\n");
  print_value("target FPS",(world->stats).target_fps);
  print_value("time scale",(world->stats).time_scale);
  printf("\n");
  print_gauge("actual FPS",t_00,&s->fps);
  print_counter("frame time",t_00,&s->frame_time_total);
  print_counter("system time",t_00,&s->system_time_total);
  print_counter("merge time",t_00,&s->merge_time_total);
  print_counter("simulation time elapsed",t_00,&s->world_time_total);
  printf("\n");
  print_gauge("entity count",t_00,&s->entity_count);
  print_gauge("component count",t_00,&s->component_count);
  print_gauge("query count",t_00,&s->query_count);
  print_gauge("system count",t_00,&s->system_count);
  print_gauge("table count",t_00,&s->table_count);
  print_gauge("singleton table count",t_00,&s->singleton_table_count);
  print_gauge("empty table count",t_00,&s->empty_table_count);
  printf("\n");
  print_counter("deferred new operations",t_00,&s->new_count);
  print_counter("deferred bulk_new operations",t_00,&s->bulk_new_count);
  print_counter("deferred delete operations",t_00,&s->delete_count);
  print_counter("deferred clear operations",t_00,&s->clear_count);
  print_counter("deferred add operations",t_00,&s->add_count);
  print_counter("deferred remove operations",t_00,&s->remove_count);
  print_counter("deferred set operations",t_00,&s->set_count);
  print_counter("discarded operations",t_00,&s->discard_count);
  printf("\n");
  return;
}

Assistant:

void ecs_dump_world_stats(
    ecs_world_t *world,
    const ecs_world_stats_t *s)
{
    int32_t t = s->t;
    
    print_counter("Frame", t, &s->frame_count_total);
    printf("-------------------------------------\n");
    print_counter("pipeline rebuilds", t, &s->pipeline_build_count_total);
    print_counter("systems ran last frame", t, &s->systems_ran_frame);
    printf("\n");
    print_value("target FPS", world->stats.target_fps);
    print_value("time scale", world->stats.time_scale);
    printf("\n");
    print_gauge("actual FPS", t, &s->fps);
    print_counter("frame time", t, &s->frame_time_total);
    print_counter("system time", t, &s->system_time_total);
    print_counter("merge time", t, &s->merge_time_total);
    print_counter("simulation time elapsed", t, &s->world_time_total);
    printf("\n");
    print_gauge("entity count", t, &s->entity_count);
    print_gauge("component count", t, &s->component_count);
    print_gauge("query count", t, &s->query_count);
    print_gauge("system count", t, &s->system_count);
    print_gauge("table count", t, &s->table_count);
    print_gauge("singleton table count", t, &s->singleton_table_count);
    print_gauge("empty table count", t, &s->empty_table_count);
    printf("\n");
    print_counter("deferred new operations", t, &s->new_count);
    print_counter("deferred bulk_new operations", t, &s->bulk_new_count);
    print_counter("deferred delete operations", t, &s->delete_count);
    print_counter("deferred clear operations", t, &s->clear_count);
    print_counter("deferred add operations", t, &s->add_count);
    print_counter("deferred remove operations", t, &s->remove_count);
    print_counter("deferred set operations", t, &s->set_count);
    print_counter("discarded operations", t, &s->discard_count);
    printf("\n");
}